

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O0

TAttributes * __thiscall
glslang::TParseContext::makeAttributes(TParseContext *this,TString *identifier,TIntermNode *node)

{
  list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_> *this_00;
  undefined1 local_40 [8];
  TAttributeArgs args;
  TIntermAggregate *agg;
  TAttributes *attributes;
  TIntermNode *node_local;
  TString *identifier_local;
  TParseContext *this_local;
  
  this_00 = &NewPoolObject<glslang::TList<glslang::TAttributeArgs>>
                       ((TList<glslang::TAttributeArgs> *)0x0)->
             super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>;
  args.args = TIntermediate::makeAggregate
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,node);
  local_40._0_4_ = attributeFromName(this,identifier);
  args._0_8_ = args.args;
  std::__cxx11::list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::
  push_back(this_00,(value_type *)local_40);
  return (TAttributes *)this_00;
}

Assistant:

TAttributes* TParseContext::makeAttributes(const TString& identifier, TIntermNode* node) const
{
    TAttributes *attributes = nullptr;
    attributes = NewPoolObject(attributes);

    // for now, node is always a simple single expression, but other code expects
    // a list, so make it so
    TIntermAggregate* agg = intermediate.makeAggregate(node);
    TAttributeArgs args = { attributeFromName(identifier), agg };
    attributes->push_back(args);
    return attributes;
}